

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVarSup.cpp
# Opt level: O1

Clause * __thiscall
Inferences::SubVarSup::performSubVarSup
          (SubVarSup *this,Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
          Literal *eqLit,TermList eqLHS,bool eqIsResult)

{
  ulong uVar1;
  Ordering *pOVar2;
  Stack<Kernel::Literal_*> *pSVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Literal *pLVar8;
  TermList what;
  Literal *pLVar9;
  TermList TVar10;
  TermList TVar11;
  TermList arg2;
  TermList s2;
  TermList s1;
  undefined4 extraout_var;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  RStack<Literal_*> resLits;
  Inference inf;
  Clause *local_100;
  GeneratingInference2 local_b0;
  Inference local_98;
  Inference local_68;
  
  if ((performSubVarSup(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,bool)
       ::subst == '\0') &&
     (iVar7 = __cxa_guard_acquire(&performSubVarSup(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,bool)
                                   ::subst), iVar7 != 0)) {
    Kernel::RobSubstitution::RobSubstitution(&performSubVarSup::subst);
    __cxa_atexit(Kernel::RobSubstitution::~RobSubstitution,&performSubVarSup::subst,&__dso_handle);
    __cxa_guard_release(&performSubVarSup(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,bool)
                         ::subst);
  }
  Kernel::RobSubstitution::reset(&performSubVarSup::subst);
  uVar5 = Kernel::Clause::maxVar(rwClause);
  uVar6 = Kernel::Clause::maxVar(eqClause);
  if ((int)uVar6 < (int)uVar5) {
    uVar6 = uVar5;
  }
  TVar11._content._0_4_ = uVar6 * 4 + 5;
  TVar11._content._4_4_ = 0;
  uVar14 = *(ulong *)&rwClause->field_0x38;
  uVar1 = *(ulong *)&eqClause->field_0x38;
  uVar6 = (rwClause->super_Unit)._inference._age;
  uVar5 = (eqClause->super_Unit)._inference._age;
  if ((int)uVar5 < (int)uVar6) {
    uVar5 = uVar6;
  }
  pLVar8 = Kernel::RobSubstitution::apply(&performSubVarSup::subst,rwLit,0);
  what = Kernel::RobSubstitution::apply(&performSubVarSup::subst,rwTerm,0);
  pLVar9 = Kernel::RobSubstitution::apply(&performSubVarSup::subst,eqLit,1);
  TVar10 = Kernel::RobSubstitution::apply(&performSubVarSup::subst,eqLHS,1);
  TVar11 = Kernel::RobSubstitution::apply(&performSubVarSup::subst,TVar11,0);
  arg2 = Kernel::EqHelper::getOtherEqualitySide(pLVar9,TVar10);
  s2 = Kernel::SortHelper::getEqualityArgumentSort(pLVar9);
  s1 = Kernel::SortHelper::getEqualityArgumentSort(pLVar9);
  TVar10 = ApplicativeHelper::createAppTerm(s1,s2,TVar11,TVar10,true);
  TVar11 = ApplicativeHelper::createAppTerm(s1,s2,TVar11,arg2,true);
  pOVar2 = (((this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
             super_InferenceEngine._salg)->_ordering)._obj;
  pLVar9 = Kernel::EqHelper::replace(pLVar8,what,TVar11);
  if ((((pLVar9->super_Term)._functor == 0) && (((pLVar9->super_Term)._args[0]._content & 4) != 0))
     && (uVar13 = (ulong)(*(uint *)&(pLVar9->super_Term).field_0xc & 0xfffffff),
        (pLVar9->super_Term)._args[uVar13]._content ==
        (pLVar9->super_Term)._args[uVar13 - 1]._content)) {
    local_100 = (Clause *)0x0;
  }
  else {
    iVar7 = (*(this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
              super_InferenceEngine._vptr_InferenceEngine[4])(this);
    if (*(char *)(CONCAT44(extraout_var,iVar7) + 0x1502) == '\x01') {
      iVar7 = (*((((this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                   super_InferenceEngine._salg)->_selector)._obj)->_vptr_LiteralSelector[2])();
      cVar4 = (char)iVar7;
    }
    else {
      cVar4 = '\0';
    }
    local_b0.rule = SUB_VAR_SUP;
    local_b0.premise1 = rwClause;
    local_b0.premise2 = eqClause;
    Kernel::Inference::Inference(&local_98,&local_b0);
    ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
             )&local_b0);
    pSVar3 = (Stack<Kernel::Literal_*> *)CONCAT71(local_b0._1_7_,local_b0.rule);
    if (pSVar3->_cursor == pSVar3->_end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(pSVar3);
    }
    *pSVar3->_cursor = pLVar9;
    pSVar3->_cursor = pSVar3->_cursor + 1;
    if ((uVar14 & 0xfffff) != 0) {
      local_100 = (Clause *)0x0;
      uVar13 = 0;
      do {
        if (rwClause->_literals[uVar13] != rwLit) {
          pLVar9 = Kernel::RobSubstitution::apply
                             (&performSubVarSup::subst,rwClause->_literals[uVar13],0);
          pLVar9 = Kernel::EqHelper::replace(pLVar9,what,TVar10);
          if ((((pLVar9->super_Term)._functor == 0) &&
              (((pLVar9->super_Term)._args[0]._content & 4) != 0)) &&
             (uVar12 = (ulong)(*(uint *)&(pLVar9->super_Term).field_0xc & 0xfffffff),
             (pLVar9->super_Term)._args[uVar12]._content ==
             (pLVar9->super_Term)._args[uVar12 - 1]._content)) goto LAB_0051af1c;
          if (((cVar4 != '\0') && (uVar13 < (*(uint *)&rwClause->field_0x3c & 0xfffff))) &&
             (iVar7 = (*pOVar2->_vptr_Ordering[2])(pOVar2,pLVar9,pLVar8), iVar7 == 1)) {
            *(int *)(DAT_00b7e1c0 + 0x1e8) = *(int *)(DAT_00b7e1c0 + 0x1e8) + 1;
            local_100 = (Clause *)0x0;
            goto LAB_0051af1c;
          }
          pSVar3 = (Stack<Kernel::Literal_*> *)CONCAT71(local_b0._1_7_,local_b0.rule);
          if (pSVar3->_cursor == pSVar3->_end) {
            ::Lib::Stack<Kernel::Literal_*>::expand(pSVar3);
          }
          *pSVar3->_cursor = pLVar9;
          pSVar3->_cursor = pSVar3->_cursor + 1;
        }
        uVar13 = uVar13 + 1;
      } while (((uint)uVar14 & 0xfffff) != uVar13);
    }
    if ((uVar1 & 0xfffff) != 0) {
      local_100 = (Clause *)0x0;
      uVar14 = 0;
      do {
        if (eqClause->_literals[uVar14] != eqLit) {
          pLVar8 = Kernel::RobSubstitution::apply
                             (&performSubVarSup::subst,eqClause->_literals[uVar14],1);
          if (((pLVar8->super_Term)._functor == 0) &&
             (((pLVar8->super_Term)._args[0]._content & 4) != 0)) {
            uVar13 = (ulong)(*(uint *)&(pLVar8->super_Term).field_0xc & 0xfffffff);
            bVar15 = (pLVar8->super_Term)._args[uVar13]._content ==
                     (pLVar8->super_Term)._args[uVar13 - 1]._content;
          }
          else {
            bVar15 = false;
          }
          if (bVar15) goto LAB_0051af1c;
          pSVar3 = (Stack<Kernel::Literal_*> *)CONCAT71(local_b0._1_7_,local_b0.rule);
          if (pSVar3->_cursor == pSVar3->_end) {
            ::Lib::Stack<Kernel::Literal_*>::expand(pSVar3);
          }
          *pSVar3->_cursor = pLVar8;
          pSVar3->_cursor = pSVar3->_cursor + 1;
        }
        uVar14 = uVar14 + 1;
      } while (((uint)uVar1 & 0xfffff) != uVar14);
    }
    if (rwClause == eqClause) {
      *(int *)(DAT_00b7e1c0 + 0xfc) = *(int *)(DAT_00b7e1c0 + 0xfc) + 1;
    }
    else if (eqIsResult) {
      *(int *)(DAT_00b7e1c0 + 0xf4) = *(int *)(DAT_00b7e1c0 + 0xf4) + 1;
    }
    else {
      *(int *)(DAT_00b7e1c0 + 0xf8) = *(int *)(DAT_00b7e1c0 + 0xf8) + 1;
    }
    local_68._0_8_ = local_98._0_8_;
    local_68._8_4_ = local_98._8_4_;
    local_68._age = local_98._age;
    local_68._splits = local_98._splits;
    local_68._ptr1 = local_98._ptr1;
    local_68._ptr2 = local_98._ptr2;
    local_68.th_ancestors = local_98.th_ancestors;
    local_68.all_ancestors = local_98.all_ancestors;
    local_100 = Kernel::Clause::fromStack
                          ((Stack<Kernel::Literal_*> *)CONCAT71(local_b0._1_7_,local_b0.rule),
                           &local_68);
    (local_100->super_Unit)._inference._age = uVar5 + 1;
LAB_0051af1c:
    ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)&local_b0);
  }
  return local_100;
}

Assistant:

Clause* SubVarSup::performSubVarSup(
    Clause* rwClause, Literal* rwLit, TermList rwTerm,
    Clause* eqClause, Literal* eqLit, TermList eqLHS, bool eqIsResult)
{
  // we want the rwClause and eqClause to be active
  ASS(rwClause->store()==Clause::ACTIVE);
  ASS(eqClause->store()==Clause::ACTIVE);
  ASS(rwTerm.isVar());

  //cout << "performSubVarSup with " << rwClause->toString() << " and " << eqClause->toString() << endl;
  //cout << "rwTerm " << rwTerm.toString() << " eqLHSS " << eqLHS.toString() << endl;

  static RobSubstitution subst;
  subst.reset();
  
  TermList freshVar = TermList(Int::max(rwClause->maxVar(), eqClause->maxVar()) + 1, false);

  unsigned rwLength = rwClause->length();
  unsigned eqLength = eqClause->length();

  int newAge=Int::max(rwClause->age(),eqClause->age())+1; // TODO isn't this set automatically?

  Literal* rwLitS = subst.apply(rwLit, 0);
  TermList rwTermS = subst.apply(rwTerm, 0);
  Literal* eqLitS = subst.apply(eqLit, 1);
  TermList eqLHSS = subst.apply(eqLHS, 1);
  TermList freshVarS = subst.apply(freshVar, 0); 

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLitS, eqLHSS);

  auto varSort = SortHelper::getEqualityArgumentSort(eqLitS);
  TermList eqSort = SortHelper::getEqualityArgumentSort(eqLitS);
  
  TermList newEqLHS = ApplicativeHelper::createAppTerm(eqSort, varSort, freshVarS, eqLHSS);
  TermList newTgtTm = ApplicativeHelper::createAppTerm(eqSort, varSort, freshVarS, tgtTerm);

  //ALWAYS(subst.unify(varSort, 0, varSort, 1));
  //ALWAYS(subst.unify(rwTerm, 0, newEqLHS, 1));

  Ordering& ordering = _salg->getOrdering();

  //Literal* rwLitS = subst.apply(rwLit, 0);
  //TermList rwTermS = subst.apply(rwTerm, 0);
  //newEqLHS = subst.apply(newEqLHS, 1);
  ///newTgtTm = subst.apply(newTgtTm, 1);

#if VDEBUG
   //ASS_EQ(rwTermS,newEqLHS);
#endif

  //cout << "Check ordering on " << tgtTermS.toString() << " and " << rwTermS.toString() << endl;

  /*if(rwLitS->isEquality()) {
    //check that we're not rewriting only the smaller side of an equality
    TermList arg0=*rwLitS->nthArgument(0);
    TermList arg1=*rwLitS->nthArgument(1);

    if(!arg0.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(ordering.getEqualityArgumentOrder(rwLitS))) {
        return 0;
      }
    } else if(!arg1.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(Ordering::reverse(ordering.getEqualityArgumentOrder(rwLitS)))) {
        return 0;
      }
    }
  }*/

  Literal* tgtLitS = EqHelper::replace(rwLitS,rwTermS,newTgtTm);

  //check we don't create an equational tautology (this happens during self-SubVarSup)
  if(EqHelper::isEqTautology(tgtLitS)) {
    return 0;
  }

  bool afterCheck = getOptions().literalMaximalityAftercheck() && _salg->getLiteralSelector().isBGComplete();

  Inference inf(GeneratingInference2(InferenceRule::SUB_VAR_SUP, rwClause, eqClause));
  RStack<Literal*> resLits;

  resLits->push(tgtLitS);
  for(unsigned i=0;i<rwLength;i++) {
    Literal* curr = (*rwClause)[i];
    if(curr!=rwLit) {
      Literal* currAfter = subst.apply(curr, 0);
      currAfter = EqHelper::replace(currAfter,rwTermS,newEqLHS);

      if(EqHelper::isEqTautology(currAfter)) {
        return nullptr;
      }
      
      if (afterCheck) {
        TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);
        if (i < rwClause->numSelected() && ordering.compare(currAfter,rwLitS) == Ordering::GREATER) {
          env.statistics->inferencesBlockedForOrderingAftercheck++;
          return nullptr;
        }
      }

      resLits->push(currAfter);
    }
  }


  for(unsigned i=0;i<eqLength;i++) {
    Literal* curr=(*eqClause)[i];
    if(curr!=eqLit) {
      Literal* currAfter = subst.apply(curr, 1);

      if(EqHelper::isEqTautology(currAfter)) {
        return nullptr;
      }

      resLits->push(currAfter);
    }
  } //no need for after check as no variables in D are bound to anyhting
    //the most that is happenning is a rearrangement of vars in D
  

  
  if(rwClause==eqClause) {
    env.statistics->selfSubVarSup++;
  } else if(eqIsResult) {
    env.statistics->forwardSubVarSup++;
  } else {
    env.statistics->backwardSubVarSup++;
  }

  //cout << "SUBVARSUP " + res->toString() << endl;
  auto res = Clause::fromStack(*resLits, inf);
  res->setAge(newAge);
  return res;
}